

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_memory_util.cpp
# Opt level: O0

void * onmemdup(void *src,size_t sz)

{
  undefined8 local_20;
  void *p;
  size_t sz_local;
  void *src_local;
  
  if ((src == (void *)0x0) || (sz == 0)) {
    local_20 = (void *)0x0;
  }
  else {
    local_20 = onmalloc(sz);
    if (local_20 != (void *)0x0) {
      memcpy(local_20,src,sz);
    }
  }
  return local_20;
}

Assistant:

void* onmemdup( const void* src, size_t sz )
{
  void* p;
  if ( src && sz>0 ) 
  {
    p = onmalloc(sz);
    if (p)
      memcpy(p,src,sz);
  }
  else {
    p = 0;
  }
  return p;
}